

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

bool __thiscall acto::core::worker_t::process(worker_t *this)

{
  object_t *this_00;
  callbacks *pcVar1;
  bool bVar2;
  int iVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar4;
  runtime_t *prVar5;
  undefined4 extraout_var;
  rep rVar6;
  bool local_99;
  lock_guard<std::mutex> local_68;
  lock_guard<std::mutex> g;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  type local_45;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_38;
  undefined1 local_30 [8];
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> msg;
  bool need_delete;
  object_t *obj;
  worker_t *this_local;
  
  do {
    this_00 = this->object_;
    if (this_00 == (object_t *)0x0) {
      this_local._7_1_ = 1;
LAB_00117efe:
      return (bool)(this_local._7_1_ & 1);
    }
    msg._M_t.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
    super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
    super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl._7_1_ = 0;
    do {
      do {
        object_t::select_message((object_t *)local_30);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
        if (bVar2) {
          pcVar1 = this->slots_;
          std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
                    (&local_38,
                     (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                     local_30);
          (*pcVar1->_vptr_callbacks[2])(pcVar1,this_00,&local_38);
          std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
                    (&local_38);
          local_99 = true;
          if (((byte)this_00->field_0x60 >> 1 & 1) == 0) {
            local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
            local_50.__r = (rep)std::chrono::operator-(&local_58,&this->start_);
            local_45 = (type)std::chrono::
                             operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                                       (&this->time_slice_,&local_50);
            std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&g._M_device + 7),(__unspec *)0x0)
            ;
            local_99 = std::operator>=(local_45);
          }
          if (local_99 == false) goto LAB_00117d36;
          g._M_device._0_4_ = 4;
        }
        else {
LAB_00117d36:
          g._M_device._0_4_ = 0;
        }
        std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
                  ((unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                   local_30);
      } while ((int)g._M_device != 0);
      std::lock_guard<std::mutex>::lock_guard(&local_68,&this_00->cs);
      if (((byte)this_00->field_0x60 >> 2 & 1) == 0) {
        if (((byte)this_00->field_0x60 >> 1 & 1) == 0) {
          bVar2 = object_t::has_messages(this_00);
          if (bVar2) {
            (*this->slots_->_vptr_callbacks[5])(this->slots_,this_00);
          }
          else {
            this_00->field_0x60 = this_00->field_0x60 & 0xf7;
          }
          goto LAB_00117e46;
        }
        this_local._7_1_ = 1;
        g._M_device._0_4_ = 1;
      }
      else {
        bVar2 = object_t::has_messages(this_00);
        if (bVar2) {
          dVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
          (this->time_slice_).__r = dVar4.__r;
          g._M_device._0_4_ = 4;
        }
        else {
          msg._M_t.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
          ._M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
          .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl._7_1_ = 1;
          this_00->field_0x60 = this_00->field_0x60 & 0xf7;
LAB_00117e46:
          g._M_device._0_4_ = 5;
        }
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_68);
      if ((int)g._M_device == 1) goto LAB_00117efe;
    } while ((int)g._M_device == 4);
    if ((msg._M_t.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>.
         _M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
         super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl._7_1_ & 1) != 0) {
      (*this->slots_->_vptr_callbacks[3])(this->slots_,this_00);
    }
    prVar5 = runtime_t::instance();
    runtime_t::release(prVar5,this_00);
    iVar3 = (*this->slots_->_vptr_callbacks[6])();
    this->object_ = (object_t *)CONCAT44(extraout_var,iVar3);
    if ((object_t *)CONCAT44(extraout_var,iVar3) == (object_t *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_00117efe;
    }
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->start_).__d.__r = rVar6;
    prVar5 = runtime_t::instance();
    runtime_t::acquire(prVar5,this->object_);
  } while( true );
}

Assistant:

bool worker_t::process() {
  while (object_t* const obj = object_) {
    bool need_delete = false;

    while (true) {
      // Handle a message.
      if (auto msg = obj->select_message()) {
        slots_->handle_message(obj, std::move(msg));
        // Continue processing messages if the object is bound to the thread or
        // the time slice has not been elapsed yet.
        if (obj->exclusive ||
            time_slice_ >= (std::chrono::steady_clock::now() - start_))
        {
          continue;
        }
      }

      // There are no messages in the object's mailbox or
      // the time slice was elapsed.
      std::lock_guard<std::mutex> g(obj->cs);

      if (obj->deleting) {
        // Drain the object's mailbox if it in the deleting state.
        if (obj->has_messages()) {
          time_slice_ = std::chrono::steady_clock::duration::max();
          continue;
        }

        need_delete = true;
        obj->scheduled = false;
      } else if (obj->exclusive) {
        // Just wait for new messages if the object
        // exclusively bound to the thread.
        return true;
      } else if (obj->has_messages()) {
        // Return object to the shared queue.
        slots_->push_object(obj);
      } else {
        obj->scheduled = false;
      }

      break;
    }

    if (need_delete) {
      slots_->push_delete(obj);
    }
    // Release current object.
    runtime_t::instance()->release(obj);

    // Retrieve next object from the shared queue.
    if ((object_ = slots_->pop_object())) {
      start_ = std::chrono::steady_clock::now();
      runtime_t::instance()->acquire(object_);
    } else {
      // Nothing to do.
      // Put itself to the idle list.
      return false;
    }
  }

  return true;
}